

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

matrix4f * __thiscall tinyusdz::value::matrix4f::operator=(matrix4f *this,matrix4d *src)

{
  ulong local_28;
  size_t i;
  size_t j;
  matrix4d *src_local;
  matrix4f *this_local;
  
  for (i = 0; i < 4; i = i + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      this->m[i][local_28] = (float)src->m[i][local_28];
    }
  }
  return this;
}

Assistant:

matrix4f &matrix4f::operator=(const matrix4d &src) {

  for (size_t j = 0; j < 4; j++) {
    for (size_t i = 0; i < 4; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}